

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::memcasecmp(char *s1,char *s2,size_t len)

{
  byte bVar1;
  byte bVar2;
  ulong in_RDX;
  int diff;
  int i;
  uchar *us2;
  uchar *us1;
  int local_34;
  
  local_34 = 0;
  while( true ) {
    if (in_RDX <= (ulong)(long)local_34) {
      return 0;
    }
    bVar1 = ascii_tolower('\0');
    bVar2 = ascii_tolower('\0');
    if ((uint)bVar1 - (uint)bVar2 != 0) break;
    local_34 = local_34 + 1;
  }
  return (uint)bVar1 - (uint)bVar2;
}

Assistant:

static int memcasecmp(const char *s1, const char *s2, size_t len) {
  const unsigned char *us1 = reinterpret_cast<const unsigned char *>(s1);
  const unsigned char *us2 = reinterpret_cast<const unsigned char *>(s2);

  for ( int i = 0; i < len; i++ ) {
    const int diff =
      static_cast<int>(static_cast<unsigned char>(ascii_tolower(us1[i]))) -
      static_cast<int>(static_cast<unsigned char>(ascii_tolower(us2[i])));
    if (diff != 0) return diff;
  }
  return 0;
}